

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::conflictAnalysis
          (HighsDomain *this,HighsInt *proofinds,double *proofvals,HighsInt prooflen,double proofrhs
          ,HighsConflictPool *conflictPool)

{
  bool bVar1;
  pointer pHVar2;
  ConflictSet *in_RDI;
  ConflictSet *in_R8;
  ConflictSet conflictSet;
  HighsDomain *in_stack_00000198;
  HighsDomain *in_stack_ffffffffffffff18;
  ConflictSet *in_stack_ffffffffffffff20;
  HighsConflictPool *in_stack_ffffffffffffffa8;
  double in_stack_ffffffffffffffb0;
  HighsInt in_stack_ffffffffffffffbc;
  double *in_stack_ffffffffffffffc0;
  HighsInt *in_stack_ffffffffffffffc8;
  
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5ca007);
  if (&pHVar2->domain != (HighsDomain *)in_RDI) {
    pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5ca034);
    bVar1 = infeasible(&pHVar2->domain);
    if (!bVar1) {
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5ca066);
      propagate(in_stack_00000198);
      pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5ca08d);
      bVar1 = infeasible(&pHVar2->domain);
      if (!bVar1) {
        ConflictSet::ConflictSet(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        ConflictSet::conflictAnalysis
                  (in_R8,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        ConflictSet::~ConflictSet(in_RDI);
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::conflictAnalysis(const HighsInt* proofinds,
                                   const double* proofvals, HighsInt prooflen,
                                   double proofrhs,
                                   HighsConflictPool& conflictPool) {
  if (&mipsolver->mipdata_->domain == this) return;

  if (mipsolver->mipdata_->domain.infeasible()) return;

  mipsolver->mipdata_->domain.propagate();
  if (mipsolver->mipdata_->domain.infeasible()) return;

  ConflictSet conflictSet(*this);
  conflictSet.conflictAnalysis(proofinds, proofvals, prooflen, proofrhs,
                               conflictPool);
}